

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void countnz(int n,int_t *xprune,int_t *nnzL,int_t *nnzU,GlobalLU_t *Glu)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int_t *piVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  
  piVar3 = Glu->xsup;
  piVar4 = Glu->xlsub;
  *nnzL = 0;
  *nnzU = Glu->xusub[n];
  uVar2 = Glu->supno[n];
  if (-1 < (int)uVar2 && 0 < n) {
    iVar9 = *piVar3;
    lVar8 = 0;
    do {
      lVar5 = lVar8 + 1;
      lVar8 = lVar8 + 1;
      iVar6 = piVar3[lVar5];
      if (iVar9 < piVar3[lVar5]) {
        iVar10 = piVar4[(long)iVar9 + 1] - piVar4[iVar9];
        iVar7 = 1;
        do {
          *nnzL = *nnzL + iVar10;
          *nnzU = *nnzU + iVar7;
          iVar10 = iVar10 + -1;
          iVar1 = iVar9 + iVar7;
          iVar7 = iVar7 + 1;
          iVar6 = piVar3[lVar8];
        } while (iVar1 < piVar3[lVar8]);
      }
      iVar9 = iVar6;
    } while (lVar8 != (ulong)uVar2 + 1);
  }
  return;
}

Assistant:

void
countnz(const int n, int_t *xprune, int_t *nnzL, int_t *nnzU, GlobalLU_t *Glu)
{
    int          nsuper, fsupc, i, j;
    int_t        jlen;
#if ( DEBUGlevel>=1 )
    int_t        irep = 0, nnzL0 = 0;
#endif
    int          *xsup;
    int_t        *xlsub;

    xsup   = Glu->xsup;
    xlsub  = Glu->xlsub;
    *nnzL  = 0;
    *nnzU  = (Glu->xusub)[n];
    nsuper = (Glu->supno)[n];

    if ( n <= 0 ) return;

    /* 
     * For each supernode
     */
    for (i = 0; i <= nsuper; i++) {
	fsupc = xsup[i];
	jlen = xlsub[fsupc+1] - xlsub[fsupc];

	for (j = fsupc; j < xsup[i+1]; j++) {
	    *nnzL += jlen;
	    *nnzU += j - fsupc + 1;
	    jlen--;
	}
#if ( DEBUGlevel>=1 )
        irep = xsup[i+1] - 1;
        nnzL0 += xprune[irep] - xlsub[irep];
#endif
    }

#if ( DEBUGlevel>=1 )
    printf("\tNo of nonzeros in symm-reduced L = %lld\n", (long long) nnzL0); fflush(stdout);
#endif
}